

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture3DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ReferenceParams *pRVar15;
  bool bVar16;
  int i;
  long lVar17;
  long lVar18;
  int y;
  int iVar19;
  int lodOffsNdx;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar48;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined4 in_XMM13_Db;
  undefined4 in_XMM13_Dc;
  undefined4 in_XMM13_Dd;
  float fVar64;
  Texture3DView TVar65;
  Vec2 clampedLod;
  Vec2 lodO;
  Vec3 coordDy;
  Vector<bool,_4> res;
  Vec3 coordDx;
  Vec4 resPix;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodBounds;
  Vector<float,_3> res_7;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture3DView src;
  float local_3bc;
  Vec2 local_3b8;
  float local_3b0;
  int local_3ac;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  undefined8 local_388;
  float local_380;
  float local_37c;
  ConstPixelBufferAccess local_378;
  int local_350 [3];
  float local_344;
  float local_340;
  float local_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  float local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  Vec4 local_308;
  float local_2f8 [8];
  float local_2d8 [8];
  float local_2b8 [8];
  PixelBufferAccess *local_298;
  ConstPixelBufferAccess *local_290;
  ReferenceParams *local_288;
  ulong local_280;
  float local_278 [4];
  undefined1 local_268 [16];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_258;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  undefined8 uStack_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  ConstPixelBufferAccess *local_1b8;
  Sampler *local_1b0;
  float local_1a8 [4];
  undefined8 local_198;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  Texture3DView local_158;
  undefined1 local_148 [4];
  float fStack_144;
  ConstPixelBufferAccess *pCStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  float fStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar53 [16];
  undefined1 auVar61 [16];
  
  local_258.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = errorMask;
  local_1b8 = reference;
  TVar65 = getSubView((TextureTestUtil *)(ulong)(uint)baseView->m_numLevels,
                      (Texture3DView *)baseView->m_levels,sampleParams->baseLevel,
                      sampleParams->maxLevel);
  pCStack_140 = TVar65.m_levels;
  local_148 = (undefined1  [4])TVar65.m_numLevels;
  local_1b0 = &sampleParams->sampler;
  TVar65 = tcu::getEffectiveTextureView((Texture3DView *)local_148,&local_258,local_1b0);
  local_158.m_levels = TVar65.m_levels;
  local_158.m_numLevels = TVar65.m_numLevels;
  local_2b8[0] = *texCoord;
  local_2d8[0] = texCoord[1];
  local_2b8[1] = texCoord[3];
  local_2b8[2] = texCoord[6];
  local_2b8[3] = texCoord[9];
  local_2d8[1] = texCoord[4];
  local_2d8[2] = texCoord[7];
  local_2d8[3] = texCoord[10];
  local_2f8[0] = texCoord[2];
  local_2f8[1] = texCoord[5];
  local_2f8[2] = texCoord[8];
  local_2f8[3] = texCoord[0xb];
  if (local_158.m_numLevels < 1) {
    local_350[0] = 0;
    local_350[1] = 0;
    local_350[2] = 0;
  }
  else {
    local_350[0] = ((local_158.m_levels)->m_size).m_data[0];
    local_350[1] = ((local_158.m_levels)->m_size).m_data[1];
    local_350[2] = ((local_158.m_levels)->m_size).m_data[2];
  }
  local_318 = (float)(result->m_size).m_data[0];
  local_328 = ZEXT416((uint)(float)(result->m_size).m_data[1]);
  local_1a8[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_1a8[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_1a8[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_1a8[3] = (sampleParams->super_RenderParams).w.m_data[3];
  local_198 = CONCAT44(local_1a8[1],local_1a8[2]);
  local_268 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_268 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_148 = (undefined1  [4])0xbf800000;
  fStack_144 = 0.0;
  pCStack_140 = (ConstPixelBufferAccess *)0x3f800000;
  local_138 = 0xbf80000000000000;
  uStack_130 = 0x3f80000000000000;
  local_378.m_format.order = 0xff00ff00;
  uStack_314 = in_XMM13_Db;
  uStack_310 = in_XMM13_Dc;
  uStack_30c = in_XMM13_Dd;
  local_2f8[4] = local_2f8[2];
  local_2f8[5] = local_2f8[1];
  local_2d8[4] = local_2d8[2];
  local_2d8[5] = local_2d8[1];
  local_2b8[4] = local_2b8[2];
  local_2b8[5] = local_2b8[1];
  tcu::RGBA::toVec((RGBA *)&local_378);
  tcu::clear(local_298,&local_308);
  if ((result->m_size).m_data[1] < 1) {
    local_378.m_data = (void *)0x0;
  }
  else {
    local_128 = local_328._0_4_;
    uStack_124 = local_328._0_4_;
    uStack_120 = local_328._0_4_;
    uStack_11c = local_328._0_4_;
    local_f8 = local_318;
    fStack_f4 = local_318;
    fStack_f0 = local_318;
    fStack_ec = local_318;
    local_268._4_4_ = local_268._0_4_;
    local_268._8_4_ = local_268._0_4_;
    local_268._12_4_ = local_268._0_4_;
    local_378.m_data = (void *)0x0;
    iVar19 = 0;
    local_290 = result;
    local_288 = sampleParams;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        fVar29 = (float)iVar19 + 0.5;
        local_178 = ZEXT416((uint)fVar29);
        local_108 = ZEXT416((uint)(fVar29 / (float)local_328._0_4_));
        auVar26._0_4_ = fVar29 + 0.0625;
        auVar26._4_4_ = fVar29 + -0.0625;
        auVar26._8_4_ = fVar29 + 0.0;
        auVar26._12_4_ = fVar29 + 0.0;
        auVar24._4_4_ = uStack_124;
        auVar24._0_4_ = local_128;
        auVar24._8_4_ = uStack_120;
        auVar24._12_4_ = uStack_11c;
        _local_e8 = divps(auVar26,auVar24);
        local_d8 = (float)local_328._0_4_ - fVar29;
        uStack_d4 = local_328._4_4_;
        uStack_d0 = local_328._8_4_;
        uStack_cc = local_328._12_4_;
        local_118 = ZEXT416((uint)(1.0 - fVar29 / (float)local_328._0_4_));
        y = 0;
        local_3ac = iVar19;
        do {
          iVar19 = local_3ac;
          tcu::ConstPixelBufferAccess::getPixel(&local_378,(int)result,y,local_3ac);
          pRVar15 = local_288;
          auVar63._0_4_ =
               (float)local_378.m_format.order - (local_288->super_RenderParams).colorBias.m_data[0]
          ;
          auVar63._4_4_ =
               (float)local_378.m_format.type - (local_288->super_RenderParams).colorBias.m_data[1];
          auVar63._8_4_ =
               (float)local_378.m_size.m_data[0] -
               (local_288->super_RenderParams).colorBias.m_data[2];
          auVar63._12_4_ =
               (float)local_378.m_size.m_data[1] -
               (local_288->super_RenderParams).colorBias.m_data[3];
          local_308.m_data =
               (float  [4])
               divps(auVar63,*(undefined1 (*) [16])(local_288->super_RenderParams).colorScale.m_data
                    );
          tcu::ConstPixelBufferAccess::getPixel(&local_378,(int)local_1b8,y,iVar19);
          auVar23._0_4_ =
               (float)local_378.m_format.order - (pRVar15->super_RenderParams).colorBias.m_data[0];
          auVar23._4_4_ =
               (float)local_378.m_format.type - (pRVar15->super_RenderParams).colorBias.m_data[1];
          auVar23._8_4_ =
               (float)local_378.m_size.m_data[0] - (pRVar15->super_RenderParams).colorBias.m_data[2]
          ;
          auVar23._12_4_ =
               (float)local_378.m_size.m_data[1] - (pRVar15->super_RenderParams).colorBias.m_data[3]
          ;
          auVar24 = divps(auVar23,*(undefined1 (*) [16])
                                   (pRVar15->super_RenderParams).colorScale.m_data);
          auVar30._0_4_ = local_308.m_data[0] - auVar24._0_4_;
          auVar30._4_4_ = local_308.m_data[1] - auVar24._4_4_;
          auVar30._8_4_ = local_308.m_data[2] - auVar24._8_4_;
          auVar30._12_4_ = local_308.m_data[3] - auVar24._12_4_;
          uVar20 = CONCAT44(auVar30._4_4_,auVar30._0_4_);
          auVar25._0_8_ = uVar20 ^ 0x8000000080000000;
          auVar25._8_4_ = -auVar30._8_4_;
          auVar25._12_4_ = -auVar30._12_4_;
          auVar26 = maxps(auVar25,auVar30);
          auVar24 = *(undefined1 (*) [16])(lookupPrec->colorThreshold).m_data;
          auVar27._4_4_ = -(uint)(auVar26._4_4_ <= auVar24._4_4_);
          auVar27._0_4_ = -(uint)(auVar26._0_4_ <= auVar24._0_4_);
          auVar27._8_4_ = -(uint)(auVar26._8_4_ <= auVar24._8_4_);
          auVar27._12_4_ = -(uint)(auVar26._12_4_ <= auVar24._12_4_);
          auVar24 = packssdw(auVar27,auVar27);
          auVar24 = packsswb(auVar24,auVar24);
          local_378.m_format.order = SUB164(auVar24 & _DAT_00ac4030,0);
          if (SUB161(auVar24 & _DAT_00ac4030,0) == '\0') {
LAB_00a22386:
            fVar29 = (float)y + 0.5;
            local_238 = ZEXT416((uint)fVar29);
            auVar28._0_4_ = fVar29 + 0.0625;
            auVar28._4_4_ = fVar29 + -0.0625;
            auVar28._8_4_ = fVar29 + 0.0;
            auVar28._12_4_ = fVar29 + 0.0;
            auVar12._4_4_ = fStack_f4;
            auVar12._0_4_ = local_f8;
            auVar12._8_4_ = fStack_f0;
            auVar12._12_4_ = fStack_ec;
            auVar24 = divps(auVar28,auVar12);
            local_188 = auVar24._0_4_ + (float)local_e8._0_4_;
            fStack_184 = auVar24._4_4_ + (float)local_e8._4_4_;
            fStack_180 = auVar24._8_4_ + fStack_e0;
            fStack_17c = auVar24._12_4_ + fStack_dc;
            if ((fStack_184 <= 1.0) || (1.0 <= local_188)) {
              uVar20 = (ulong)(1.0 < fStack_184);
              fStack_a4 = fVar29 / local_318;
              local_c8 = local_318 - fVar29;
              uStack_c4 = uStack_314;
              uStack_c0 = uStack_310;
              uStack_bc = uStack_30c;
              fStack_b4 = 1.0 - fStack_a4;
              local_a8 = local_108._0_4_;
              uStack_a0 = local_108._8_4_;
              uStack_9c = local_108._12_4_;
              local_b8 = local_118._0_4_;
              uStack_b0 = local_118._8_4_;
              uStack_ac = local_118._12_4_;
              do {
                local_37c = (float)local_238._0_4_;
                if (uVar20 != 0) {
                  local_37c = local_c8;
                }
                fVar29 = local_1a8[uVar20 * 3 + 2];
                local_1d8 = ZEXT416((uint)fVar29);
                fVar64 = local_2f8[uVar20 * 3];
                fVar31 = local_2f8[uVar20 * 3 + 1];
                uVar1 = *(ulong *)(local_1a8 + uVar20 * 3);
                auVar37._8_8_ = 0;
                auVar37._0_8_ = uVar1;
                fVar35 = (float)uVar1;
                fStack_1c4 = (float)(uVar1 >> 0x20);
                uVar21 = (uint)(uVar20 == 0);
                auVar46._0_4_ = (int)(uVar21 << 0x1f) >> 0x1f;
                auVar46._4_4_ = (int)(uVar21 << 0x1f) >> 0x1f;
                auVar46._8_8_ = 0;
                auVar14._4_4_ = fStack_a4;
                auVar14._0_4_ = local_a8;
                auVar14._8_4_ = uStack_a0;
                auVar14._12_4_ = uStack_9c;
                auVar13._4_4_ = fStack_b4;
                auVar13._0_4_ = local_b8;
                auVar13._8_4_ = uStack_b0;
                auVar13._12_4_ = uStack_ac;
                auVar24 = ~auVar46 & auVar13 | auVar14 & auVar46;
                fVar45 = auVar24._0_4_;
                fVar48 = auVar24._4_4_;
                fVar49 = (1.0 - fVar48) - fVar45;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = *(ulong *)(local_1a8 + uVar20 * 3 + 1);
                auVar26 = divps(auVar24,auVar8);
                auVar50._4_4_ = auVar26._4_4_;
                auVar50._0_4_ = auVar50._4_4_;
                auVar50._8_4_ = auVar50._4_4_;
                auVar50._12_4_ = auVar50._4_4_;
                auVar51._4_12_ = auVar50._4_12_;
                auVar51._0_4_ = auVar50._4_4_ + fVar49 / fVar35 + auVar26._0_4_;
                fVar36 = local_2d8[uVar20 * 3];
                fVar44 = local_2d8[uVar20 * 3 + 2];
                fVar2 = local_2b8[uVar20 * 3 + 1];
                fVar3 = local_2b8[uVar20 * 3 + 2];
                auVar56._0_4_ = fVar2 * fVar45;
                auVar56._4_4_ = fVar36 * fVar49;
                auVar56._8_4_ = auVar24._8_4_ * 0.0;
                auVar56._12_4_ = auVar24._12_4_ * 0.0;
                fVar4 = local_2d8[uVar20 * 3 + 1];
                auVar7._4_4_ = fVar35;
                auVar7._0_4_ = fStack_1c4;
                auVar7._8_8_ = 0;
                auVar26 = divps(auVar56,auVar7);
                fVar5 = local_2b8[uVar20 * 3];
                auVar62._0_4_ = fVar5 * fVar49;
                auVar62._4_4_ = fVar4 * fVar45;
                auVar62._8_4_ = auVar24._8_4_ * 0.0;
                auVar62._12_4_ = auVar24._12_4_ * 0.0;
                auVar63 = divps(auVar62,auVar37);
                auVar57._0_4_ = fVar48 * fVar3;
                auVar57._4_4_ = fVar48 * fVar44;
                auVar57._8_4_ = fVar48 * 0.0;
                auVar57._12_4_ = fVar48 * 0.0;
                auVar32._4_4_ = fVar29;
                auVar32._0_4_ = fVar29;
                auVar32._8_4_ = fVar29;
                auVar32._12_4_ = fVar29;
                auVar24 = divps(auVar57,auVar32);
                auVar58._0_4_ = auVar24._0_4_ + auVar63._0_4_ + auVar26._0_4_;
                auVar58._4_4_ = auVar24._4_4_ + auVar63._4_4_ + auVar26._4_4_;
                auVar58._8_4_ = auVar24._8_4_ + auVar63._8_4_ + auVar26._8_4_;
                auVar58._12_4_ = auVar24._12_4_ + auVar63._12_4_ + auVar26._12_4_;
                fVar6 = local_2f8[uVar20 * 3 + 2];
                local_378.m_size.m_data[0] =
                     (int)(((fVar45 * fVar31) / fStack_1c4 + (fVar49 * fVar64) / fVar35 +
                           (fVar48 * fVar6) / fVar29) / auVar51._0_4_);
                auVar53._0_8_ = auVar51._0_8_;
                auVar53._8_4_ = auVar50._4_4_;
                auVar53._12_4_ = auVar50._4_4_;
                auVar52._8_8_ = auVar53._8_8_;
                auVar52._4_4_ = auVar51._0_4_;
                auVar52._0_4_ = auVar51._0_4_;
                auVar24 = divps(auVar58,auVar52);
                local_378.m_format = auVar24._0_8_;
                auVar10._4_4_ = uStack_314;
                auVar10._0_4_ = local_318;
                auVar10._8_4_ = uStack_310;
                auVar10._12_4_ = uStack_30c;
                local_48 = ZEXT416((uint)(fVar29 * local_318));
                local_1c8 = fStack_1c4 * fVar29;
                fVar49 = fVar45 + -1.0;
                auVar59._4_12_ = auVar10._4_12_;
                fVar55 = (local_318 * fVar49 + (float)local_238._0_4_) * local_1c8 -
                         (fVar29 * local_318 * fVar45 + (float)local_238._0_4_ * fStack_1c4) *
                         fVar35;
                uStack_210 = 0;
                local_58 = (fVar2 - fVar5) * fVar29 + (fVar3 - fVar2) * fVar35;
                fStack_54 = (fVar4 - fVar36) * fVar29 + (fVar44 - fVar4) * fVar35;
                fStack_50 = fVar29 * 0.0 + fVar35 * 0.0;
                fStack_4c = fVar29 * 0.0 + fVar35 * 0.0;
                local_33c = (fVar31 - fVar64) * fVar29 + (fVar6 - fVar31) * fVar35;
                local_340 = (fVar64 - fVar6) * fStack_1c4;
                local_68 = (fVar5 - fVar3) * fStack_1c4;
                fStack_64 = (fVar36 - fVar44) * fStack_1c4;
                fStack_60 = fStack_1c4 * 0.0;
                fStack_5c = fStack_1c4 * 0.0;
                local_1f8._0_4_ = fVar35 * fStack_1c4 * fVar29;
                local_78._0_4_ = (float)local_1f8._0_4_ * local_318;
                local_78._4_4_ = fStack_1c4;
                local_78._8_8_ = 0;
                auVar59._0_4_ = fVar55 * fVar55;
                auVar54._0_4_ = (fVar49 * local_68 + fVar45 * local_58) * (float)local_78._0_4_;
                auVar54._4_4_ = (fVar49 * fStack_64 + fVar45 * fStack_54) * (float)local_78._0_4_;
                auVar54._8_4_ = (fVar48 * fStack_60 + fVar45 * fStack_50) * (float)local_78._0_4_;
                auVar54._12_4_ = (fVar48 * fStack_5c + fVar45 * fStack_4c) * (float)local_78._0_4_;
                auVar61._0_8_ = auVar59._0_8_;
                auVar61._8_4_ = uStack_314;
                auVar61._12_4_ = uStack_314;
                auVar60._8_8_ = auVar61._8_8_;
                auVar60._4_4_ = auVar59._0_4_;
                auVar60._0_4_ = auVar59._0_4_;
                auVar24 = divps(auVar54,auVar60);
                local_388 = auVar24._0_8_;
                local_380 = ((local_340 * fVar49 + fVar45 * local_33c) * (float)local_78._0_4_) /
                            auVar59._0_4_;
                local_98 = -fVar35;
                fStack_94 = -fStack_1c4;
                local_3a0 = 0.0;
                local_3a8 = 0;
                lVar17 = 0;
                do {
                  *(float *)((long)&local_3a8 + lVar17 * 4) = (float)local_350[lVar17];
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                local_378.m_pitch.m_data[1] = 0;
                local_378.m_size.m_data[2] = 0;
                local_378.m_pitch.m_data[0] = 0;
                lVar17 = 0;
                do {
                  local_378.m_size.m_data[lVar17 + 2] =
                       (int)(*(float *)((long)&local_388 + lVar17 * 4) *
                            *(float *)((long)&local_3a8 + lVar17 * 4));
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                fVar45 = fVar48 + -1.0;
                local_344 = fStack_1c4 * (float)local_328._0_4_;
                uStack_90 = 0x80000000;
                uStack_8c = 0x80000000;
                fVar49 = ((float)local_328._0_4_ * fVar45 + (float)local_178._0_4_) * local_1c8 +
                         (local_344 * fVar48 + (float)local_178._0_4_ * fVar29) * local_98;
                local_1e8 = fVar35 * (fVar2 - fVar3) + fStack_1c4 * (fVar3 - fVar5);
                fStack_1e4 = fVar35 * (fVar4 - fVar44) + fStack_1c4 * (fVar44 - fVar36);
                fStack_1e0 = fVar35 * 0.0 + fStack_1c4 * 0.0;
                fStack_1dc = fVar35 * 0.0 + fStack_1c4 * 0.0;
                local_208 = (fVar5 - fVar2) * fVar29;
                fStack_204 = (fVar36 - fVar4) * fVar29;
                fStack_200 = fVar29 * 0.0;
                fStack_1fc = fVar29 * 0.0;
                fVar29 = (fVar64 - fVar31) * fVar29;
                fVar64 = (fVar31 - fVar6) * fVar35 + (fVar6 - fVar64) * fStack_1c4;
                local_338 = ZEXT416((uint)fVar64);
                _local_218 = CONCAT44(fVar4,fVar29);
                local_1f8._0_4_ = (float)local_1f8._0_4_ * (float)local_328._0_4_;
                fVar49 = fVar49 * fVar49;
                local_1f8._4_4_ = fStack_1c4;
                local_1f8._8_8_ = 0;
                fStack_224 = (float)local_1f8._0_4_;
                local_228 = (float)local_1f8._0_4_;
                fStack_220 = (float)local_1f8._0_4_;
                fStack_21c = (float)local_1f8._0_4_;
                auVar47._0_4_ = (fVar45 * local_208 + fVar48 * local_1e8) * (float)local_1f8._0_4_;
                auVar47._4_4_ = (fVar45 * fStack_204 + fVar48 * fStack_1e4) * (float)local_1f8._0_4_
                ;
                auVar47._8_4_ = (fVar48 * fStack_200 + fVar48 * fStack_1e0) * (float)local_1f8._0_4_
                ;
                auVar47._12_4_ =
                     (fVar48 * fStack_1fc + fVar48 * fStack_1dc) * (float)local_1f8._0_4_;
                auVar9._4_4_ = fVar49;
                auVar9._0_4_ = fVar49;
                auVar9._8_4_ = local_328._4_4_;
                auVar9._12_4_ = local_328._4_4_;
                auVar24 = divps(auVar47,auVar9);
                local_3a8 = auVar24._0_8_;
                local_3a0 = ((fVar29 * fVar45 + fVar48 * fVar64) * (float)local_1f8._0_4_) / fVar49;
                local_3b0 = 0.0;
                local_3b8.m_data[0] = 0.0;
                local_3b8.m_data[1] = 0.0;
                lVar17 = 0;
                do {
                  local_3b8.m_data[lVar17] = (float)local_350[lVar17];
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                local_380 = 0.0;
                local_388 = 0;
                lVar17 = 0;
                do {
                  *(float *)((long)&local_388 + lVar17 * 4) =
                       *(float *)((long)&local_3a8 + lVar17 * 4) * local_3b8.m_data[lVar17];
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 3);
                local_3bc = (float)local_178._0_4_;
                if (uVar20 != 0) {
                  local_3bc = local_d8;
                }
                fStack_1c0 = fStack_1c4;
                fStack_1bc = fStack_1c4;
                local_168 = fStack_1c4;
                fStack_164 = fStack_1c4;
                fStack_160 = fStack_1c4;
                fStack_15c = fStack_1c4;
                local_88 = (float)local_78._0_4_;
                fStack_84 = (float)local_78._0_4_;
                fStack_80 = (float)local_78._0_4_;
                fStack_7c = (float)local_78._0_4_;
                tcu::computeLodBoundsFromDerivates
                          ((tcu *)&local_280,(float)local_378.m_size.m_data[2],
                           (float)local_378.m_pitch.m_data[0],(float)local_378.m_pitch.m_data[1],
                           (float)local_388,local_388._4_4_,local_380,lodPrec);
                lVar17 = 0;
                do {
                  fVar29 = *(float *)(local_148 + lVar17 * 8) + local_37c;
                  fVar64 = *(float *)(local_148 + lVar17 * 8 + 4) + local_3bc;
                  fVar44 = fVar64 / (float)local_328._0_4_;
                  fVar31 = fVar44 + -1.0;
                  auVar11._4_4_ = uStack_314;
                  auVar11._0_4_ = local_318;
                  auVar11._8_4_ = uStack_310;
                  auVar11._12_4_ = uStack_30c;
                  auVar38._4_12_ = auVar11._4_12_;
                  fVar36 = (local_318 * fVar31 + fVar29) * local_1c8 +
                           ((float)local_48._0_4_ * fVar44 + local_168 * fVar29) * local_98;
                  auVar38._0_4_ = fVar36 * fVar36;
                  auVar33._0_4_ = (fVar31 * local_68 + fVar44 * local_58) * local_88;
                  auVar33._4_4_ = (fVar31 * fStack_64 + fVar44 * fStack_54) * fStack_84;
                  auVar33._8_4_ = (fStack_60 * 0.0 + fStack_50 * 0.0) * fStack_80;
                  auVar33._12_4_ = (fStack_5c * 0.0 + fStack_4c * 0.0) * fStack_7c;
                  auVar40._0_8_ = auVar38._0_8_;
                  auVar40._8_4_ = uStack_314;
                  auVar40._12_4_ = uStack_314;
                  auVar39._8_8_ = auVar40._8_8_;
                  auVar39._4_4_ = auVar38._0_4_;
                  auVar39._0_4_ = auVar38._0_4_;
                  auVar24 = divps(auVar33,auVar39);
                  local_3b8.m_data[0] = SUB84(auVar24._0_8_,0);
                  local_3b8.m_data[1] = SUB84(auVar24._0_8_,4);
                  local_3b0 = ((local_340 * fVar31 + local_33c * fVar44) * (float)local_78._0_4_) /
                              auVar38._0_4_;
                  local_390 = 0.0;
                  local_398 = 0;
                  lVar18 = 0;
                  do {
                    *(float *)((long)&local_398 + lVar18 * 4) = (float)local_350[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  local_3a0 = 0.0;
                  local_3a8 = 0;
                  lVar18 = 0;
                  do {
                    *(float *)((long)&local_3a8 + lVar18 * 4) =
                         local_3b8.m_data[lVar18] * *(float *)((long)&local_398 + lVar18 * 4);
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  fVar29 = fVar29 / local_318;
                  fVar31 = fVar29 + -1.0;
                  auVar41._4_12_ = local_328._4_12_;
                  fVar64 = ((float)local_328._0_4_ * fVar31 + fVar64) * local_1c8 +
                           (local_344 * fVar29 + fVar64 * (float)local_1d8._0_4_) * local_98;
                  auVar41._0_4_ = fVar64 * fVar64;
                  auVar34._0_4_ = (fVar31 * local_208 + fVar29 * local_1e8) * local_228;
                  auVar34._4_4_ = (fVar31 * fStack_204 + fVar29 * fStack_1e4) * fStack_224;
                  auVar34._8_4_ = (fStack_200 * 0.0 + fStack_1e0 * 0.0) * fStack_220;
                  auVar34._12_4_ = (fStack_1fc * 0.0 + fStack_1dc * 0.0) * fStack_21c;
                  auVar43._0_8_ = auVar41._0_8_;
                  auVar43._8_4_ = local_328._4_4_;
                  auVar43._12_4_ = local_328._4_4_;
                  auVar42._8_8_ = auVar43._8_8_;
                  auVar42._4_4_ = auVar41._0_4_;
                  auVar42._0_4_ = auVar41._0_4_;
                  auVar24 = divps(auVar34,auVar42);
                  local_398 = auVar24._0_8_;
                  local_390 = ((local_218 * fVar31 + (float)local_338._0_4_ * fVar29) *
                              (float)local_1f8._0_4_) / auVar41._0_4_;
                  local_278[2] = 0.0;
                  local_278[0] = 0.0;
                  local_278[1] = 0.0;
                  lVar18 = 0;
                  do {
                    local_278[lVar18] = (float)local_350[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  local_3b0 = 0.0;
                  local_3b8.m_data[0] = 0.0;
                  local_3b8.m_data[1] = 0.0;
                  lVar18 = 0;
                  do {
                    local_3b8.m_data[lVar18] =
                         *(float *)((long)&local_398 + lVar18 * 4) * local_278[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  tcu::computeLodBoundsFromDerivates
                            ((tcu *)&local_398,(float)local_3a8,local_3a8._4_4_,local_3a0,
                             local_3b8.m_data[0],local_3b8.m_data[1],local_3b0,lodPrec);
                  fVar29 = (float)(local_280 >> 0x20);
                  uVar21 = -(uint)((float)local_280 <= (float)local_398);
                  uVar22 = -(uint)(local_398._4_4_ <= fVar29);
                  local_280 = CONCAT44(~uVar22 & (uint)local_398._4_4_,
                                       ~uVar21 & (uint)(float)local_398) |
                              CONCAT44((uint)fVar29 & uVar22,(uint)(float)local_280 & uVar21);
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 4);
                local_3b8.m_data[0] = (float)local_280 + (float)local_268._0_4_;
                local_3b8.m_data[1] = (float)(local_280 >> 0x20) + (float)local_268._4_4_;
                local_398._0_4_ = local_288->minLod;
                local_398._4_4_ = local_288->maxLod;
                tcu::clampLodBounds((tcu *)&local_3a8,&local_3b8,(Vec2 *)&local_398,lodPrec);
                bVar16 = tcu::isLookupResultValid
                                   (&local_158,local_1b0,lookupPrec,(Vec3 *)&local_378,
                                    (Vec2 *)&local_3a8,&local_308);
                result = local_290;
                if (bVar16) goto LAB_00a22e2d;
              } while ((uVar20 == 0) && (uVar20 = 1, 1.0 <= local_188));
            }
            local_378.m_size.m_data[2] = -0xffff01;
            tcu::RGBA::toVec((RGBA *)(local_378.m_size.m_data + 2));
            result = local_290;
            tcu::PixelBufferAccess::setPixel(local_298,(Vec4 *)&local_378,y,local_3ac,0);
            local_378.m_data = (void *)(ulong)((int)local_378.m_data + 1);
          }
          else {
            uVar20 = 0xffffffffffffffff;
            do {
              if (uVar20 == 2) goto LAB_00a22e2d;
              uVar1 = uVar20 + 1;
              lVar17 = uVar20 - 6;
              uVar20 = uVar1;
            } while (*(char *)((long)local_378.m_size.m_data + lVar17) != '\0');
            if (uVar1 < 3) goto LAB_00a22386;
          }
LAB_00a22e2d:
          y = y + 1;
          iVar19 = local_3ac;
        } while (y < (result->m_size).m_data[0]);
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < (result->m_size).m_data[1]);
  }
  if (local_258.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_378.m_data;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture3DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture3DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4								tq					= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4								rq					= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const tcu::IVec3							srcSize				= tcu::IVec3(src.getWidth(), src.getHeight(), src.getDepth());

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triT[2]				= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3								triR[2]				= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	const float									posEps				= 1.0f / float(1<<MIN_SUBPIXEL_BITS);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const bool		tri0	= (wx-posEps)/dstW + (wy-posEps)/dstH <= 1.0f;
				const bool		tri1	= (wx+posEps)/dstW + (wy+posEps)/dstH >= 1.0f;

				bool			isOk	= false;

				DE_ASSERT(tri0 || tri1);

				// Pixel can belong to either of the triangles if it lies close enough to the edge.
				for (int triNdx = (tri0?0:1); triNdx <= (tri1?1:0); triNdx++)
				{
					const float		triWx	= triNdx ? dstW - wx : wx;
					const float		triWy	= triNdx ? dstH - wy : wy;
					const float		triNx	= triNdx ? 1.0f - nx : nx;
					const float		triNy	= triNdx ? 1.0f - ny : ny;

					const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
					const tcu::Vec3	coordDx		= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
															triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
					const tcu::Vec3	coordDy		= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
															triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

					tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDx.z(), coordDy.x(), coordDy.y(), coordDy.z(), lodPrec);

					// Compute lod bounds across lodOffsets range.
					for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
					{
						const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
						const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
						const float		nxo		= wxo/dstW;
						const float		nyo		= wyo/dstH;

						const tcu::Vec3	coordDxo	= tcu::Vec3(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
																triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
						const tcu::Vec3	coordDyo	= tcu::Vec3(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
																triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
						const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDxo.z(), coordDyo.x(), coordDyo.y(), coordDyo.z(), lodPrec);

						lodBounds.x() = de::min(lodBounds.x(), lodO.x());
						lodBounds.y() = de::max(lodBounds.y(), lodO.y());
					}

					const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);

					if (tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix))
					{
						isOk = true;
						break;
					}
				}

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}